

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsGearbox.cpp
# Opt level: O3

void __thiscall
chrono::ChShaftsGearbox::ChShaftsGearbox(ChShaftsGearbox *this,ChShaftsGearbox *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  ChPhysicsItem::ChPhysicsItem(&this->super_ChPhysicsItem,&other->super_ChPhysicsItem);
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChShaftsGearbox_00b22548
  ;
  ChConstraintThreeGeneric::ChConstraintThreeGeneric(&this->constraint);
  (this->shaft_dir).m_data[2] = 0.0;
  (this->shaft_dir).m_data[0] = 0.0;
  (this->shaft_dir).m_data[1] = 0.0;
  dVar1 = other->r2;
  dVar2 = other->r3;
  dVar3 = other->torque_react;
  this->r1 = other->r1;
  this->r2 = dVar1;
  this->r3 = dVar2;
  this->torque_react = dVar3;
  this->shaft1 = (ChShaft *)0x0;
  this->shaft2 = (ChShaft *)0x0;
  this->body = (ChBodyFrame *)0x0;
  if (other != this) {
    (this->shaft_dir).m_data[0] = (other->shaft_dir).m_data[0];
    (this->shaft_dir).m_data[1] = (other->shaft_dir).m_data[1];
    (this->shaft_dir).m_data[2] = (other->shaft_dir).m_data[2];
  }
  return;
}

Assistant:

ChShaftsGearbox::ChShaftsGearbox(const ChShaftsGearbox& other) : ChPhysicsItem(other) {
    r1 = other.r1;
    r2 = other.r2;
    r3 = other.r3;

    torque_react = other.torque_react;
    shaft1 = 0;
    shaft2 = 0;
    body = 0;

    shaft_dir = other.shaft_dir;
}